

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  ulong uVar1;
  int iVar2;
  int __fd;
  int *piVar3;
  int fd;
  ulong uVar4;
  
  uVar1 = (ulong)(uint)stdio_count;
  if ((options->flags & 8) != 0) {
    setsid();
  }
  if (0 < stdio_count) {
    uVar4 = 0;
    do {
      if ((uint)pipes[uVar4][1] < uVar4) {
        iVar2 = fcntl64((ulong)(uint)pipes[uVar4][1],0,uVar1);
        pipes[uVar4][1] = iVar2;
        if (iVar2 == -1) goto LAB_00550274;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (0 < stdio_count) {
    iVar2 = 0;
    do {
      __fd = pipes[iVar2][1];
      if (__fd < 0) {
        if (iVar2 < 3) {
          __fd = open64("/dev/null",(uint)(iVar2 != 0) * 2);
          fd = __fd;
          if (__fd != -1) goto LAB_00550194;
          goto LAB_00550282;
        }
      }
      else {
        fd = pipes[iVar2][0];
LAB_00550194:
        if (iVar2 == __fd) {
          uv__cloexec_fcntl(__fd,0);
        }
        else {
          iVar2 = dup2(__fd,iVar2);
        }
        if (iVar2 == -1) {
LAB_00550282:
          piVar3 = __errno_location();
          iVar2 = *piVar3;
          goto LAB_0055028f;
        }
        if (iVar2 < 3) {
          uv__nonblock_fcntl(iVar2,0);
        }
        if (stdio_count <= fd) {
          uv__close(fd);
        }
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < stdio_count);
  }
  if (0 < stdio_count) {
    uVar4 = 0;
    do {
      if (stdio_count <= pipes[uVar4][1]) {
        uv__close(pipes[uVar4][1]);
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (options->cwd != (char *)0x0) {
    iVar2 = chdir(options->cwd);
    if (iVar2 != 0) goto LAB_00550274;
  }
  if ((options->flags & 3) != 0) {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    setgroups(0,(__gid_t *)0x0);
    *piVar3 = iVar2;
  }
  if ((options->flags & 2) != 0) {
    iVar2 = setgid(options->gid);
    if (iVar2 != 0) goto LAB_00550274;
  }
  if ((options->flags & 1) != 0) {
    iVar2 = setuid(options->uid);
    if (iVar2 != 0) goto LAB_00550274;
  }
  if (options->env != (char **)0x0) {
    _environ = options->env;
  }
  execvp(options->file,options->args);
LAB_00550274:
  piVar3 = __errno_location();
  iVar2 = *piVar3;
LAB_0055028f:
  uv__write_int(error_fd,-iVar2);
  _exit(0x7f);
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  int close_fd;
  int use_fd;
  int fd;

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
    if (pipes[fd][1] == -1) {
      uv__write_int(error_fd, -errno);
      _exit(127);
    }
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set
         */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd == -1) {
          uv__write_int(error_fd, -errno);
          _exit(127);
        }
      }
    }

    if (fd == use_fd)
      uv__cloexec_fcntl(use_fd, 0);
    else
      fd = dup2(use_fd, fd);

    if (fd == -1) {
      uv__write_int(error_fd, -errno);
      _exit(127);
    }

    if (fd <= 2)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];

    if (use_fd >= stdio_count)
      uv__close(use_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd)) {
    uv__write_int(error_fd, -errno);
    _exit(127);
  }

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid)) {
    uv__write_int(error_fd, -errno);
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid)) {
    uv__write_int(error_fd, -errno);
    _exit(127);
  }

  if (options->env != NULL) {
    environ = options->env;
  }

  execvp(options->file, options->args);
  uv__write_int(error_fd, -errno);
  _exit(127);
}